

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_regex.hpp
# Opt level: O3

void __thiscall iutest::detail::iuRegex::iuRegex(iuRegex *this,iuRegex *rhs)

{
  pointer pcVar1;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&this->m_re,&rhs->m_re);
  (this->m_pattern)._M_dataplus._M_p = (pointer)&(this->m_pattern).field_2;
  pcVar1 = (rhs->m_pattern)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_pattern,pcVar1,pcVar1 + (rhs->m_pattern)._M_string_length);
  return;
}

Assistant:

iuRegex(const iuRegex & rhs) : m_re(rhs.m_re), m_pattern(rhs.m_pattern) {}